

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.h
# Opt level: O0

int booster::locale::util::parse_tz(string *tz)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong in_RDI;
  int minutes;
  int hours;
  char *end;
  char *begin;
  uint i;
  string ltz;
  int gmtoff;
  char *local_60;
  char *local_58;
  undefined4 local_50;
  uint local_3c;
  string local_38 [36];
  int local_14;
  ulong local_10;
  int local_4;
  
  local_14 = 0;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  for (local_3c = 0; uVar4 = (ulong)local_3c, uVar2 = std::__cxx11::string::size(), uVar4 < uVar2;
      local_3c = local_3c + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    if ((*pcVar3 < 'a') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), 'z' < *pcVar3)) {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar3 != ' ') {
        pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
        std::__cxx11::string::operator+=(local_38,*pcVar3);
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
      std::__cxx11::string::operator+=(local_38,*pcVar3 + -0x20);
    }
  }
  iVar1 = std::__cxx11::string::compare((ulong)local_38,0,(char *)0x3);
  if ((iVar1 == 0) ||
     (iVar1 = std::__cxx11::string::compare((ulong)local_38,0,(char *)0x3), iVar1 == 0)) {
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < 4) {
      local_4 = 0;
    }
    else {
      lVar5 = std::__cxx11::string::c_str();
      local_58 = (char *)(lVar5 + 3);
      local_60 = (char *)0x0;
      lVar5 = strtol(local_58,&local_60,10);
      if (local_60 != local_58) {
        local_14 = (int)lVar5 * 0xe10 + local_14;
      }
      if (*local_60 == ':') {
        local_58 = local_60 + 1;
        lVar5 = strtol(local_58,&local_60,10);
        if (local_60 != local_58) {
          local_14 = (int)lVar5 * 0x3c + local_14;
        }
      }
      local_4 = local_14;
    }
  }
  else {
    local_4 = 0;
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

inline int parse_tz(std::string const &tz) 
    {
        int gmtoff = 0;
        std::string ltz;
        for(unsigned i=0;i<tz.size();i++) {
            if('a' <= tz[i] && tz[i] <= 'z')
                ltz += tz[i]-'a' + 'A';
            else if(tz[i]==' ')
                ;
            else
                ltz+=tz[i];
        }
        if(ltz.compare(0,3,"GMT")!=0 && ltz.compare(0,3,"UTC")!=0)
            return 0;
        if(ltz.size()<=3)
            return 0;
        char const *begin = ltz.c_str()+3;
        char *end=0;
        int hours = strtol(begin,&end,10);
        if(end != begin) {
            gmtoff+=hours * 3600;
        }
        if(*end==':') {
            begin=end+1;
            int minutes = strtol(begin,&end,10);
            if(end!=begin)
                gmtoff+=minutes * 60;
        }
        return gmtoff;
    }